

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportInstallFileGenerator::ComplainAboutMissingTarget
          (cmExportInstallFileGenerator *this,cmGeneratorTarget *depender,
          cmGeneratorTarget *dependee,int occurrences)

{
  cmExportSet *pcVar1;
  ostream *poVar2;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"install(EXPORT \"",0x10);
  pcVar1 = this->IEGen->ExportSet;
  poVar4 = (ostream *)local_1a0;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(pcVar1->Name)._M_dataplus._M_p,(pcVar1->Name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ...) ",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"includes target \"",0x11);
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" which requires target \"",0x19);
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  if (occurrences == 0) {
    lVar5 = 0x1e;
    pcVar6 = "that is not in the export set.";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"that is not in this export set, but ",0x24);
    poVar4 = (ostream *)std::ostream::operator<<(local_1a0,occurrences);
    lVar5 = 0x11;
    pcVar6 = " times in others.";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
  std::__cxx11::stringbuf::str();
  cmSystemTools::Error(&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void cmExportInstallFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee, int occurrences)
{
  std::ostringstream e;
  e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
    << "\" ...) "
    << "includes target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (occurrences == 0) {
    e << "that is not in the export set.";
  } else {
    e << "that is not in this export set, but " << occurrences
      << " times in others.";
  }
  cmSystemTools::Error(e.str());
}